

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codepage.cpp
# Opt level: O0

basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *
booster::locale::conv::impl::convert_to<wchar_t>
          (char *begin,char *end,char *charset,method_type how)

{
  undefined1 uVar1;
  uint uVar2;
  undefined8 *puVar3;
  pointer pcVar4;
  undefined8 uVar5;
  char *in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *in_RDI;
  uint in_R8D;
  unique_ptr<booster::locale::conv::impl::converter_to_utf<wchar_t>,_std::default_delete<booster::locale::conv::impl::converter_to_utf<wchar_t>_>_>
  cvt;
  pointer in_stack_ffffffffffffff38;
  uconv_to_utf<wchar_t> *in_stack_ffffffffffffff40;
  iconv_to_utf<wchar_t> *in_stack_ffffffffffffff50;
  allocator *paVar6;
  undefined7 in_stack_ffffffffffffff78;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *this;
  allocator local_61;
  string local_60 [32];
  undefined4 local_40;
  uint local_24;
  char *local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  this = in_RDI;
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::
  unique_ptr<booster::locale::conv::impl::converter_to_utf<wchar_t>,std::default_delete<booster::locale::conv::impl::converter_to_utf<wchar_t>>>
  ::unique_ptr<std::default_delete<booster::locale::conv::impl::converter_to_utf<wchar_t>>,void>
            ((unique_ptr<booster::locale::conv::impl::converter_to_utf<wchar_t>,_std::default_delete<booster::locale::conv::impl::converter_to_utf<wchar_t>_>_>
              *)in_stack_ffffffffffffff40);
  puVar3 = (undefined8 *)operator_new(0x18);
  *puVar3 = 0;
  puVar3[1] = 0;
  puVar3[2] = 0;
  iconv_to_utf<wchar_t>::iconv_to_utf(in_stack_ffffffffffffff50);
  std::
  unique_ptr<booster::locale::conv::impl::converter_to_utf<wchar_t>,_std::default_delete<booster::locale::conv::impl::converter_to_utf<wchar_t>_>_>
  ::reset((unique_ptr<booster::locale::conv::impl::converter_to_utf<wchar_t>,_std::default_delete<booster::locale::conv::impl::converter_to_utf<wchar_t>_>_>
           *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  pcVar4 = std::
           unique_ptr<booster::locale::conv::impl::converter_to_utf<wchar_t>,_std::default_delete<booster::locale::conv::impl::converter_to_utf<wchar_t>_>_>
           ::operator->((unique_ptr<booster::locale::conv::impl::converter_to_utf<wchar_t>,_std::default_delete<booster::locale::conv::impl::converter_to_utf<wchar_t>_>_>
                         *)0x229b25);
  uVar2 = (**pcVar4->_vptr_converter_to_utf)(pcVar4,local_20,(ulong)local_24);
  uVar1 = (undefined1)uVar2;
  if ((uVar2 & 1) == 0) {
    puVar3 = (undefined8 *)operator_new(0x18);
    *puVar3 = 0;
    puVar3[1] = 0;
    puVar3[2] = 0;
    uconv_to_utf<wchar_t>::uconv_to_utf(in_stack_ffffffffffffff40);
    std::
    unique_ptr<booster::locale::conv::impl::converter_to_utf<wchar_t>,_std::default_delete<booster::locale::conv::impl::converter_to_utf<wchar_t>_>_>
    ::reset((unique_ptr<booster::locale::conv::impl::converter_to_utf<wchar_t>,_std::default_delete<booster::locale::conv::impl::converter_to_utf<wchar_t>_>_>
             *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    pcVar4 = std::
             unique_ptr<booster::locale::conv::impl::converter_to_utf<wchar_t>,_std::default_delete<booster::locale::conv::impl::converter_to_utf<wchar_t>_>_>
             ::operator->((unique_ptr<booster::locale::conv::impl::converter_to_utf<wchar_t>,_std::default_delete<booster::locale::conv::impl::converter_to_utf<wchar_t>_>_>
                           *)0x229c15);
    uVar2 = (**pcVar4->_vptr_converter_to_utf)(pcVar4,local_20,(ulong)local_24);
    if ((uVar2 & 1) == 0) {
      uVar5 = __cxa_allocate_exception(0x30);
      paVar6 = &local_61;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_60,local_20,paVar6);
      invalid_charset_error::invalid_charset_error
                ((invalid_charset_error *)this,(string *)CONCAT17(uVar1,in_stack_ffffffffffffff78));
      __cxa_throw(uVar5,&invalid_charset_error::typeinfo,
                  invalid_charset_error::~invalid_charset_error);
    }
    pcVar4 = std::
             unique_ptr<booster::locale::conv::impl::converter_to_utf<wchar_t>,_std::default_delete<booster::locale::conv::impl::converter_to_utf<wchar_t>_>_>
             ::operator->((unique_ptr<booster::locale::conv::impl::converter_to_utf<wchar_t>,_std::default_delete<booster::locale::conv::impl::converter_to_utf<wchar_t>_>_>
                           *)0x229c4c);
    (*pcVar4->_vptr_converter_to_utf[1])(this,pcVar4,local_10,local_18);
  }
  else {
    pcVar4 = std::
             unique_ptr<booster::locale::conv::impl::converter_to_utf<wchar_t>,_std::default_delete<booster::locale::conv::impl::converter_to_utf<wchar_t>_>_>
             ::operator->((unique_ptr<booster::locale::conv::impl::converter_to_utf<wchar_t>,_std::default_delete<booster::locale::conv::impl::converter_to_utf<wchar_t>_>_>
                           *)0x229b5c);
    (*pcVar4->_vptr_converter_to_utf[1])(this,pcVar4,local_10,local_18);
  }
  local_40 = 1;
  std::
  unique_ptr<booster::locale::conv::impl::converter_to_utf<wchar_t>,_std::default_delete<booster::locale::conv::impl::converter_to_utf<wchar_t>_>_>
  ::~unique_ptr((unique_ptr<booster::locale::conv::impl::converter_to_utf<wchar_t>,_std::default_delete<booster::locale::conv::impl::converter_to_utf<wchar_t>_>_>
                 *)in_stack_ffffffffffffff40);
  return in_RDI;
}

Assistant:

std::basic_string<CharType> convert_to(
                                        char const *begin,
                                        char const *end,
                                        char const *charset,
                                        method_type how)
                {
                    std::unique_ptr<converter_to_utf<CharType> > cvt;
                    #ifdef BOOSTER_LOCALE_WITH_ICONV
                    cvt.reset(new iconv_to_utf<CharType>());
                    if(cvt->open(charset,how))
                        return cvt->convert(begin,end);
                    #endif
                    #ifdef BOOSTER_LOCALE_WITH_ICU
                    cvt.reset(new uconv_to_utf<CharType>());
                    if(cvt->open(charset,how))
                        return cvt->convert(begin,end);
                    #endif
                    #ifdef BOOSTER_LOCALE_WITH_WCONV
                    cvt.reset(new wconv_to_utf<CharType>());
                    if(cvt->open(charset,how))
                        return cvt->convert(begin,end);
                    #endif
                    throw invalid_charset_error(charset);
                }